

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_lookup.c
# Opt level: O0

void test_write_disk_lookup(void)

{
  int iVar1;
  archive *_a;
  int64_t id_00;
  int64_t id;
  int umagic;
  int gmagic;
  archive *a;
  void *in_stack_ffffffffffffffd8;
  archive *in_stack_ffffffffffffffe0;
  _func_int64_t_void_ptr_char_ptr_int64_t *in_stack_ffffffffffffffe8;
  undefined4 uVar2;
  wchar_t wVar3;
  
  wVar3 = L'𓕹';
  uVar2 = 0x1234;
  _a = archive_write_disk_new();
  assertion_assert((char *)CONCAT44(wVar3,uVar2),(wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20)
                   ,(wchar_t)in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0,
                   in_stack_ffffffffffffffd8);
  archive_write_disk_gid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cee0a,(void *)id);
  archive_write_disk_gid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cee51,(void *)id);
  archive_write_disk_gid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cee98,(void *)id);
  archive_write_disk_uid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1ceedb,(void *)id);
  archive_write_disk_uid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cef22,(void *)id);
  archive_write_disk_set_group_lookup
            (_a,(void *)CONCAT44(wVar3,uVar2),in_stack_ffffffffffffffe8,
             (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cef6d,(void *)id);
  archive_write_disk_gid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cefb4,(void *)id);
  archive_write_disk_gid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1ceffb,(void *)id);
  archive_write_disk_set_group_lookup
            (_a,(void *)CONCAT44(wVar3,uVar2),in_stack_ffffffffffffffe8,
             (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf03d,(void *)id);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf071,(void *)id);
  archive_write_disk_set_user_lookup
            (_a,(void *)CONCAT44(wVar3,uVar2),in_stack_ffffffffffffffe8,
             (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf0bc,(void *)id);
  archive_write_disk_uid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf102,(void *)id);
  archive_write_disk_uid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf149,(void *)id);
  archive_write_disk_set_user_lookup
            (_a,(void *)CONCAT44(wVar3,uVar2),in_stack_ffffffffffffffe8,
             (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf18b,(void *)id);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf1bf,(void *)id);
  iVar1 = archive_write_disk_set_standard_lookup(in_stack_ffffffffffffffe0);
  if (iVar1 == 0) {
    id_00 = archive_write_disk_gid
                      (_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
    if (id_00 != 0) {
      id_00 = archive_write_disk_gid(_a,(char *)CONCAT44(wVar3,uVar2),id_00);
    }
    failure("Unable to verify lookup of group #0");
    assertion_equal_int((char *)_a,wVar3,id_00,(char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf26e,
                        (void *)id);
    in_stack_ffffffffffffffe8 =
         (_func_int64_t_void_ptr_char_ptr_int64_t *)
         archive_write_disk_uid(_a,(char *)CONCAT44(wVar3,uVar2),id_00);
    failure("Unable to verify lookup of user #0");
    assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                        (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf2c7,(void *)id);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                   ,L'm');
    test_skipping("standard uname/gname lookup");
  }
  archive_write_disk_set_group_lookup
            (_a,(void *)CONCAT44(wVar3,uVar2),in_stack_ffffffffffffffe8,
             (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf309,(void *)id);
  archive_write_disk_set_user_lookup
            (_a,(void *)CONCAT44(wVar3,uVar2),in_stack_ffffffffffffffe8,
             (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf34b,(void *)id);
  archive_write_disk_gid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf38e,(void *)id);
  archive_write_disk_uid(_a,(char *)CONCAT44(wVar3,uVar2),(int64_t)in_stack_ffffffffffffffe8);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf3d1,(void *)id);
  wVar3 = L'𓕹';
  uVar2 = 0x1234;
  archive_write_disk_set_group_lookup
            (_a,(void *)0x1357900001234,in_stack_ffffffffffffffe8,
             (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf42c,(void *)id);
  archive_write_disk_set_user_lookup
            (_a,(void *)CONCAT44(wVar3,uVar2),in_stack_ffffffffffffffe8,
             (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf477,(void *)id);
  archive_read_free((archive *)0x1cf481);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf4af,(void *)id);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf4e3,(void *)id);
  assertion_equal_int((char *)_a,wVar3,(longlong)in_stack_ffffffffffffffe8,
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1cf517,(void *)id);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_lookup)
{
	struct archive *a;
	int gmagic = 0x13579, umagic = 0x1234;
	int64_t id;

	assert((a = archive_write_disk_new()) != NULL);

	/* Default uname/gname lookups always return ID. */
	assertEqualInt(0, archive_write_disk_gid(a, "", 0));
	assertEqualInt(12, archive_write_disk_gid(a, "root", 12));
	assertEqualInt(12, archive_write_disk_gid(a, "wheel", 12));
	assertEqualInt(0, archive_write_disk_uid(a, "", 0));
	assertEqualInt(18, archive_write_disk_uid(a, "root", 18));

	/* Register some weird lookup functions. */
	assertEqualInt(ARCHIVE_OK, archive_write_disk_set_group_lookup(a,
		       &gmagic, &group_lookup, &group_cleanup));
	/* Verify that our new function got called. */
	assertEqualInt(73, archive_write_disk_gid(a, "FOOGROUP", 8));
	assertEqualInt(1, archive_write_disk_gid(a, "NOTFOOGROUP", 8));

	/* De-register. */
	assertEqualInt(ARCHIVE_OK,
		       archive_write_disk_set_group_lookup(a, NULL, NULL, NULL));
	/* Ensure our cleanup function got called. */
	assertEqualInt(gmagic, 0x2468);

	/* Same thing with uname lookup.... */
	assertEqualInt(ARCHIVE_OK, archive_write_disk_set_user_lookup(a,
			   &umagic, &user_lookup, &user_cleanup));
	assertEqualInt(2, archive_write_disk_uid(a, "FOO", 0));
	assertEqualInt(74, archive_write_disk_uid(a, "NOTFOO", 1));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_disk_set_user_lookup(a, NULL, NULL, NULL));
	assertEqualInt(umagic, 0x2345);

	/* Try the standard lookup functions. */
	if (archive_write_disk_set_standard_lookup(a) != ARCHIVE_OK) {
		skipping("standard uname/gname lookup");
	} else {
		/* Try a few common names for group #0. */
		id = archive_write_disk_gid(a, "wheel", 8);
		if (id != 0)
			id = archive_write_disk_gid(a, "root", 8);
		failure("Unable to verify lookup of group #0");
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Not yet implemented on Windows. */
		assertEqualInt(8, id);
#else
		assertEqualInt(0, id);
#endif

		/* Try a few common names for user #0. */
		id = archive_write_disk_uid(a, "root", 8);
		failure("Unable to verify lookup of user #0");
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Not yet implemented on Windows. */
		assertEqualInt(8, id);
#else
		assertEqualInt(0, id);
#endif
	}

	/* Deregister again and verify the default lookups again. */
	assertEqualInt(ARCHIVE_OK,
	    archive_write_disk_set_group_lookup(a, NULL, NULL, NULL));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_disk_set_user_lookup(a, NULL, NULL, NULL));
	assertEqualInt(0, archive_write_disk_gid(a, "", 0));
	assertEqualInt(0, archive_write_disk_uid(a, "", 0));

	/* Re-register our custom handlers. */
	gmagic = 0x13579;
	umagic = 0x1234;
	assertEqualInt(ARCHIVE_OK, archive_write_disk_set_group_lookup(a,
			   &gmagic, &group_lookup, &group_cleanup));
	assertEqualInt(ARCHIVE_OK, archive_write_disk_set_user_lookup(a,
		      &umagic, &user_lookup, &user_cleanup));

	/* Destroy the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Verify our cleanup functions got called. */
	assertEqualInt(gmagic, 0x2468);
	assertEqualInt(umagic, 0x2345);
}